

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fare_rule.c
# Opt level: O0

int equal_fare_rule(fare_rule_t *a,fare_rule_t *b)

{
  int iVar1;
  byte local_19;
  fare_rule_t *b_local;
  fare_rule_t *a_local;
  
  iVar1 = strcmp(a->fare_id,b->fare_id);
  local_19 = 0;
  if (iVar1 == 0) {
    iVar1 = strcmp(a->route_id,b->route_id);
    local_19 = 0;
    if (iVar1 == 0) {
      iVar1 = strcmp(a->origin_id,b->origin_id);
      local_19 = 0;
      if (iVar1 == 0) {
        iVar1 = strcmp(a->destination_id,b->destination_id);
        local_19 = 0;
        if (iVar1 == 0) {
          iVar1 = strcmp(a->contains_id,b->contains_id);
          local_19 = iVar1 != 0 ^ 0xff;
        }
      }
    }
  }
  return (int)(local_19 & 1);
}

Assistant:

int equal_fare_rule(const fare_rule_t *a, const fare_rule_t *b) {
    return (!strcmp(a->fare_id, b->fare_id) &&
             !strcmp(a->route_id, b->route_id) &&
             !strcmp(a->origin_id, b->origin_id) &&
             !strcmp(a->destination_id, b->destination_id) &&
             !strcmp(a->contains_id, b->contains_id));
}